

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O2

void __thiscall TestRegenerateCmakeHeader::Run(TestRegenerateCmakeHeader *this)

{
  __type _Var1;
  runtime_error *this_00;
  string expectedOutput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  ostringstream oss;
  Configuration config;
  
  Configuration::Configuration(&config);
  std::__cxx11::string::assign((char *)&config);
  std::__cxx11::string::assign((char *)&config.licenseString);
  std::__cxx11::string::assign((char *)&config.regenTag);
  std::__cxx11::string::string
            ((string *)&expectedOutput,
             "#\n# Copyright (c) My Company. All rights reserved.\n# My\n# multiline\n# license.\n#\n\n# AUTOGENERATED - do not edit, your changes will be lost\n# If you must edit, remove these two lines to avoid regeneration\n\n"
             ,(allocator *)&oss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  RegenerateCmakeHeader((ostream *)&oss,&config);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_3b8,&expectedOutput);
  std::__cxx11::string::~string((string *)&local_3b8);
  if (_Var1) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::__cxx11::string::~string((string *)&expectedOutput);
    Configuration::~Configuration(&config);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeHeader) {
  Configuration config;
  config.companyName = "My Company";
  config.licenseString = "My\nmultiline\nlicense.";
  config.regenTag = "AUTOGENERATED";

  const std::string expectedOutput(
      "#\n"
      "# Copyright (c) My Company. All rights reserved.\n"
      "# My\n"
      "# multiline\n"
      "# license.\n"
      "#\n"
      "\n"
      "# AUTOGENERATED - do not edit, your changes will be lost\n"
      "# If you must edit, remove these two lines to avoid regeneration\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeHeader(oss, config);

  ASSERT(oss.str() == expectedOutput);
}